

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::FilenameToClassname
                   (string *__return_storage_ptr__,string *filename)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 *puVar3;
  undefined4 local_24;
  int i;
  int lastindex;
  string *filename_local;
  string *result;
  
  std::__cxx11::string::find_last_of((char *)filename,0x5dcadc);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  for (local_24 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_24 < uVar1;
      local_24 = local_24 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar2 == '/') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar3 = 0x5c;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilenameToClassname(const string& filename) {
  int lastindex = filename.find_last_of(".");
  std::string result = filename.substr(0, lastindex);
  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '/') {
      result[i] = '\\';
    }
  }
  return result;
}